

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsClutch.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsClutch::ArchiveOUT(ChShaftsClutch *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsClutch>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveOUT((ChPhysicsItem *)this,marchive);
  local_30 = &this->maxT;
  local_38 = "maxT";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->minT;
  local_38 = "minT";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->modulation;
  local_38 = "modulation";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsClutch::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsClutch>();

    // serialize parent class
    ChShaftsCouple::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(maxT);
    marchive << CHNVP(minT);
    marchive << CHNVP(modulation);
}